

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Object * __thiscall symbols::StringObject::nextItem(StringObject *this)

{
  char cVar1;
  ulong uVar2;
  Object *pOVar3;
  ulong uVar4;
  undefined6 uStack_2e;
  undefined2 uStack_28;
  undefined4 local_26;
  undefined2 local_22;
  
  uVar4 = (ulong)this->iter_index;
  uVar2 = (this->value)._M_string_length;
  if (this->iter_index < (int)uVar2) {
    pOVar3 = (Object *)operator_new(0x38);
    if (uVar2 <= uVar4) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar2);
    }
    cVar1 = (this->value)._M_dataplus._M_p[uVar4];
    pOVar3->_type = STRINGTYPE;
    pOVar3->_vptr_Object = (_func_int **)&PTR_type_00125d00;
    pOVar3[1]._vptr_Object = (_func_int **)(pOVar3 + 2);
    *(char *)&pOVar3[2]._vptr_Object = cVar1;
    *(undefined1 *)((long)&pOVar3[2]._vptr_Object + 1) = 0;
    *(ulong *)((long)&pOVar3[2]._vptr_Object + 2) = CONCAT26(uStack_28,uStack_2e);
    *(undefined4 *)((long)&pOVar3[2]._type + 2) = local_26;
    *(undefined2 *)&pOVar3[2].field_0xe = local_22;
    *(undefined8 *)&pOVar3[1]._type = 1;
    *(undefined4 *)&pOVar3[3]._vptr_Object = 0;
    this->iter_index = this->iter_index + 1;
  }
  else {
    pOVar3 = (Object *)operator_new(0x10);
    pOVar3->_type = NULLTYPE;
    pOVar3->_vptr_Object = (_func_int **)&PTR_type_00125b90;
  }
  return pOVar3;
}

Assistant:

Object* StringObject::nextItem()
{
    if(this->iter_index >= (int)this->value.size()){
        return new NullObject();
    }
    auto curStr = new StringObject(std::string(1, this->value.at(this->iter_index)));
    this->iter_index++;
    return curStr;
}